

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerHLSL::emit_push_constant_block(CompilerHLSL *this,SPIRVariable *var)

{
  uint binding;
  IVariant *pIVar1;
  SPIRType *pSVar2;
  bool bVar3;
  uint32_t uVar4;
  TypedID<(spirv_cross::Types)1> id;
  size_type sVar5;
  CompilerError *this_00;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  size_t sVar8;
  Decoration *pDVar9;
  string *psVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2;
  char (*in_stack_fffffffffffffda0) [69];
  allocator local_1d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  uint32_t local_1b4;
  spirv_cross local_1b0 [32];
  string local_190;
  undefined1 local_170 [8];
  string member_name;
  undefined1 local_148 [8];
  string backup_name;
  TypedID<(spirv_cross::Types)1> *member;
  uint local_118;
  uint32_t offset;
  uint i;
  uint constant_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  VectorView<spirv_cross::Meta::Decoration> *local_d0;
  Vector<Decoration> *memb;
  string local_c0;
  char local_90 [32];
  string local_70;
  uint32_t local_4c;
  SPIRType *pSStack_48;
  uint32_t failed_index;
  SPIRType *type;
  RootConstants *layout;
  iterator __end3;
  iterator __begin3;
  vector<spirv_cross::RootConstants,_std::allocator<spirv_cross::RootConstants>_> *__range3;
  SPIRVariable *local_18;
  SPIRVariable *var_local;
  CompilerHLSL *this_local;
  
  local_18 = var;
  var_local = (SPIRVariable *)this;
  __range3._4_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  sVar5 = ::std::
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          ::count(&(this->super_CompilerGLSL).flattened_buffer_blocks,
                  (key_type *)((long)&__range3 + 4));
  if (sVar5 == 0) {
    bVar3 = ::std::vector<spirv_cross::RootConstants,_std::allocator<spirv_cross::RootConstants>_>::
            empty(&this->root_constants_layout);
    if (bVar3) {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x20])(this,local_18);
    }
    else {
      __end3 = ::std::
               vector<spirv_cross::RootConstants,_std::allocator<spirv_cross::RootConstants>_>::
               begin(&this->root_constants_layout);
      layout = (RootConstants *)
               ::std::
               vector<spirv_cross::RootConstants,_std::allocator<spirv_cross::RootConstants>_>::end
                         (&this->root_constants_layout);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<spirv_cross::RootConstants_*,_std::vector<spirv_cross::RootConstants,_std::allocator<spirv_cross::RootConstants>_>_>
                                         *)&layout), bVar3) {
        type = (SPIRType *)
               __gnu_cxx::
               __normal_iterator<spirv_cross::RootConstants_*,_std::vector<spirv_cross::RootConstants,_std::allocator<spirv_cross::RootConstants>_>_>
               ::operator*(&__end3);
        uVar4 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(local_18->super_IVariant).field_0xc);
        pSStack_48 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar4);
        local_4c = 0;
        bVar3 = CompilerGLSL::buffer_is_packing_standard
                          (&this->super_CompilerGLSL,pSStack_48,BufferPackingHLSLCbufferPackOffset,
                           &local_4c,*(uint32_t *)&(type->super_IVariant)._vptr_IVariant,
                           *(uint32_t *)((long)&(type->super_IVariant)._vptr_IVariant + 4));
        if (!bVar3) {
          memb._7_1_ = 1;
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          pIVar1 = &local_18->super_IVariant;
          uVar4 = TypedID::operator_cast_to_unsigned_int
                            ((TypedID *)&(pSStack_48->super_IVariant).self);
          (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                    (local_90,this,(ulong)uVar4,1);
          CompilerGLSL::to_member_name_abi_cxx11_
                    (&local_c0,&this->super_CompilerGLSL,pSStack_48,local_4c);
          join<char_const(&)[26],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[9],std::__cxx11::string,char_const(&)[2],char_const(&)[16],unsigned_int&,char_const(&)[9],std::__cxx11::string,char_const(&)[69]>
                    (&local_70,(spirv_cross *)"Root constant cbuffer ID ",
                     (char (*) [26])&pIVar1->self,(TypedID<(spirv_cross::Types)0> *)" (name: ",
                     (char (*) [9])local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x682405,
                     (char (*) [2])0x6627e1,(char (*) [16])&local_4c,(uint *)" (name: ",
                     (char (*) [9])&local_c0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ") cannot be expressed with either HLSL packing layout or packoffset.",
                     in_stack_fffffffffffffda0);
          CompilerError::CompilerError(this_00,&local_70);
          memb._7_1_ = 0;
          __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        uVar4 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(pSStack_48->super_IVariant).self);
        Compiler::set_extended_decoration
                  ((Compiler *)this,uVar4,SPIRVCrossDecorationExplicitOffset,0);
        memb._0_4_ = TypedID::operator_cast_to_unsigned_int
                               ((TypedID *)&(local_18->super_IVariant).self);
        pmVar6 = ::std::
                 unordered_map<unsigned_int,_bool,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bool>_>_>
                 ::operator[](&(this->super_CompilerGLSL).flattened_structs,(key_type *)&memb);
        *pmVar6 = false;
        ::std::
        unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear(&pSStack_48->member_name_cache);
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_18->super_IVariant).self);
        CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar4);
        pmVar7 = ::std::
                 unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                 ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                              &(pSStack_48->super_IVariant).self);
        local_d0 = &(pmVar7->members).super_VectorView<spirv_cross::Meta::Decoration>;
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_18->super_IVariant).self);
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(&local_f0,this,(ulong)uVar4);
        binding = (type->super_IVariant).self.id;
        ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)binding;
        to_resource_register_abi_cxx11_
                  ((string *)&i,this,HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT,'b',binding,
                   *(uint32_t *)&(type->super_IVariant).field_0xc);
        CompilerGLSL::statement<char_const(&)[34],std::__cxx11::string,std::__cxx11::string>
                  (&this->super_CompilerGLSL,(char (*) [34])"cbuffer SPIRV_CROSS_RootConstant_",
                   &local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i
                  );
        ::std::__cxx11::string::~string((string *)&i);
        ::std::__cxx11::string::~string((string *)&local_f0);
        CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
        offset = 0;
        for (local_118 = 0; sVar8 = VectorView<spirv_cross::Meta::Decoration>::size(local_d0),
            local_118 < sVar8; local_118 = local_118 + 1) {
          pDVar9 = VectorView<spirv_cross::Meta::Decoration>::operator[](local_d0,(ulong)local_118);
          if ((*(uint *)&(type->super_IVariant)._vptr_IVariant <= pDVar9->offset) &&
             (pDVar9->offset < *(uint *)((long)&(type->super_IVariant)._vptr_IVariant + 4))) {
            backup_name.field_2._8_8_ =
                 VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                           (&(pSStack_48->member_types).
                             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                            (ulong)local_118);
            CompilerGLSL::add_member_name(&this->super_CompilerGLSL,pSStack_48,offset);
            member_name.field_2._12_4_ =
                 TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_48->super_IVariant).self);
            psVar10 = Compiler::get_member_name_abi_cxx11_
                                ((Compiler *)this,(TypeID)member_name.field_2._12_4_,local_118);
            ::std::__cxx11::string::string((string *)local_148,(string *)psVar10);
            CompilerGLSL::to_member_name_abi_cxx11_
                      ((string *)local_170,&this->super_CompilerGLSL,pSStack_48,local_118);
            uVar4 = TypedID::operator_cast_to_unsigned_int
                              ((TypedID *)&(local_18->super_IVariant).self);
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])
                      (local_1b0,this,(ulong)uVar4,1);
            join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
                      (&local_190,local_1b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x66305e
                       ,(char (*) [2])local_170,ts_2);
            ::std::__cxx11::string::operator=((string *)local_170,(string *)&local_190);
            ::std::__cxx11::string::~string((string *)&local_190);
            ::std::__cxx11::string::~string((string *)local_1b0);
            ParsedIR::sanitize_underscores((string *)local_170);
            local_1b4 = (uint32_t)
                        TypedID::operator_cast_to_TypedID
                                  ((TypedID *)&(pSStack_48->super_IVariant).self);
            Compiler::set_member_name((Compiler *)this,(TypeID)local_1b4,offset,(string *)local_170)
            ;
            pSVar2 = pSStack_48;
            uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)backup_name.field_2._8_8_);
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_1d8,"",&local_1d9);
            ts_2 = &local_1d8;
            (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x15])
                      (this,pSVar2,(ulong)uVar4,(ulong)local_118,ts_2,
                       (ulong)*(uint *)&(type->super_IVariant)._vptr_IVariant);
            ::std::__cxx11::string::~string((string *)&local_1d8);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
            id = TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_48->super_IVariant).self);
            Compiler::set_member_name((Compiler *)this,(TypeID)id.id,offset,(string *)local_148);
            offset = offset + 1;
            ::std::__cxx11::string::~string((string *)local_170);
            ::std::__cxx11::string::~string((string *)local_148);
          }
        }
        CompilerGLSL::end_scope_decl(&this->super_CompilerGLSL);
        __gnu_cxx::
        __normal_iterator<spirv_cross::RootConstants_*,_std::vector<spirv_cross::RootConstants,_std::allocator<spirv_cross::RootConstants>_>_>
        ::operator++(&__end3);
      }
    }
  }
  else {
    CompilerGLSL::emit_buffer_block_flattened(&this->super_CompilerGLSL,local_18);
  }
  return;
}

Assistant:

void CompilerHLSL::emit_push_constant_block(const SPIRVariable &var)
{
	if (flattened_buffer_blocks.count(var.self))
	{
		emit_buffer_block_flattened(var);
	}
	else if (root_constants_layout.empty())
	{
		emit_buffer_block(var);
	}
	else
	{
		for (const auto &layout : root_constants_layout)
		{
			auto &type = get<SPIRType>(var.basetype);

			uint32_t failed_index = 0;
			if (buffer_is_packing_standard(type, BufferPackingHLSLCbufferPackOffset, &failed_index, layout.start,
			                               layout.end))
				set_extended_decoration(type.self, SPIRVCrossDecorationExplicitOffset);
			else
			{
				SPIRV_CROSS_THROW(join("Root constant cbuffer ID ", var.self, " (name: ", to_name(type.self), ")",
				                       ", member index ", failed_index, " (name: ", to_member_name(type, failed_index),
				                       ") cannot be expressed with either HLSL packing layout or packoffset."));
			}

			flattened_structs[var.self] = false;
			type.member_name_cache.clear();
			add_resource_name(var.self);
			auto &memb = ir.meta[type.self].members;

			statement("cbuffer SPIRV_CROSS_RootConstant_", to_name(var.self),
			          to_resource_register(HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT, 'b', layout.binding, layout.space));
			begin_scope();

			// Index of the next field in the generated root constant constant buffer
			auto constant_index = 0u;

			// Iterate over all member of the push constant and check which of the fields
			// fit into the given root constant layout.
			for (auto i = 0u; i < memb.size(); i++)
			{
				const auto offset = memb[i].offset;
				if (layout.start <= offset && offset < layout.end)
				{
					const auto &member = type.member_types[i];

					add_member_name(type, constant_index);
					auto backup_name = get_member_name(type.self, i);
					auto member_name = to_member_name(type, i);
					member_name = join(to_name(var.self), "_", member_name);
					ParsedIR::sanitize_underscores(member_name);
					set_member_name(type.self, constant_index, member_name);
					emit_struct_member(type, member, i, "", layout.start);
					set_member_name(type.self, constant_index, backup_name);

					constant_index++;
				}
			}

			end_scope_decl();
		}
	}
}